

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O0

optional<uint256> * __thiscall
BlockFilterIndex::ReadFilterHeader(BlockFilterIndex *this,int height,uint256 *expected_block_hash)

{
  long lVar1;
  bool bVar2;
  pointer key;
  pair<uint256,_(anonymous_namespace)::DBVal> *in_RSI;
  optional<uint256> *in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000040;
  char (*in_stack_00000050) [17];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000060;
  pair<uint256,_(anonymous_namespace)::DBVal> read_out;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe9c;
  base_blob<256U> *in_stack_fffffffffffffea0;
  pair<uint256,_(anonymous_namespace)::DBVal> *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffeb8;
  CDBWrapper *in_stack_fffffffffffffef0;
  char *flag;
  int in_stack_ffffffffffffff0c;
  ConstevalFormatString<3U> in_stack_ffffffffffffff48;
  string_view in_stack_ffffffffffffff50;
  string_view in_stack_ffffffffffffff60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::pair<uint256,_(anonymous_namespace)::DBVal>::
  pair<uint256,_(anonymous_namespace)::DBVal,_true>(in_stack_fffffffffffffea8);
  key = std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::operator->
                  ((unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)
                   CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  anon_unknown.dwarf_1909551::DBHeightKey::DBHeightKey
            ((DBHeightKey *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),0);
  bVar2 = CDBWrapper::
          Read<(anonymous_namespace)::DBHeightKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                    (in_stack_fffffffffffffef0,(DBHeightKey *)key,in_RSI);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    bVar2 = ::operator!=((base_blob<256U> *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      flag = "%s: previous block header belongs to unexpected block %s; expected %s\n";
      base_blob<256u>::ToString_abi_cxx11_(in_stack_fffffffffffffea0);
      base_blob<256u>::ToString_abi_cxx11_(in_stack_fffffffffffffea0);
      uVar3 = 4;
      LogPrintFormatInternal<char[17],std::__cxx11::string,std::__cxx11::string>
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff50,in_stack_ffffffffffffff0c,
                 (LogFlags)flag,in_stack_00000040,in_stack_ffffffffffffff48,in_stack_00000050,
                 in_stack_00000058,in_stack_00000060);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe9c,uVar3));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe9c,uVar3));
      std::optional<uint256>::optional(in_RDI);
    }
    else {
      std::optional<uint256>::optional<uint256_&,_true>
                ((optional<uint256> *)in_stack_fffffffffffffea8,(uint256 *)in_stack_fffffffffffffea0
                );
    }
  }
  else {
    std::optional<uint256>::optional(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uint256> BlockFilterIndex::ReadFilterHeader(int height, const uint256& expected_block_hash)
{
    std::pair<uint256, DBVal> read_out;
    if (!m_db->Read(DBHeightKey(height), read_out)) {
        return std::nullopt;
    }

    if (read_out.first != expected_block_hash) {
        LogError("%s: previous block header belongs to unexpected block %s; expected %s\n",
                         __func__, read_out.first.ToString(), expected_block_hash.ToString());
        return std::nullopt;
    }

    return read_out.second.header;
}